

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-list.c
# Opt level: O2

uint8_t object_list_entry_line_attribute(object_list_entry_t *entry)

{
  object *poVar1;
  _Bool _Var2;
  uint8_t uVar3;
  
  uVar3 = '\x01';
  if (((entry != (object_list_entry_t *)0x0) && (poVar1 = entry->object, poVar1 != (object *)0x0))
     && (poVar1->kind != (object_kind *)0x0)) {
    poVar1 = cave->objects[poVar1->oidx];
    _Var2 = is_unknown(poVar1);
    uVar3 = '\x04';
    if ((!_Var2) && (uVar3 = '\x11', poVar1->known->artifact == (artifact *)0x0)) {
      _Var2 = object_flavor_is_aware(poVar1);
      uVar3 = '\f';
      if (_Var2) {
        uVar3 = (poVar1->kind->cost == L'\0') + '\x01';
      }
    }
  }
  return uVar3;
}

Assistant:

uint8_t object_list_entry_line_attribute(const object_list_entry_t *entry)
{
	uint8_t attr;
	struct object *base_obj;

	if (entry == NULL || entry->object == NULL || entry->object->kind == NULL)
		return COLOUR_WHITE;

	base_obj = cave->objects[entry->object->oidx];

	if (is_unknown(base_obj))
		/* unknown object */
		attr = COLOUR_RED;
	else if (base_obj->known->artifact)
		/* known artifact */
		attr = COLOUR_VIOLET;
	else if (!object_flavor_is_aware(base_obj))
		/* unaware of kind */
		attr = COLOUR_L_RED;
	else if (base_obj->kind->cost == 0)
		/* worthless */
		attr = COLOUR_SLATE;
	else
		/* default */
		attr = COLOUR_WHITE;

	return attr;
}